

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O0

void __thiscall
icu_63::NFSubstitution::doSubstitution
          (NFSubstitution *this,int64_t number,UnicodeString *toInsertInto,int32_t _pos,
          int32_t recursionCount,UErrorCode *status)

{
  NFRuleSet *this_00;
  DecimalFormat *pDVar1;
  int iVar2;
  int32_t iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 extraout_XMM0_Qa;
  Formattable local_1b0;
  undefined1 local_140 [8];
  UnicodeString temp_1;
  int64_t numberToFormat_1;
  Formattable local_e8;
  undefined1 local_78 [8];
  UnicodeString temp;
  double numberToFormat;
  UErrorCode *status_local;
  int32_t recursionCount_local;
  int32_t _pos_local;
  UnicodeString *toInsertInto_local;
  int64_t number_local;
  NFSubstitution *this_local;
  
  if (this->ruleSet == (NFRuleSet *)0x0) {
    if (this->numberFormat != (DecimalFormat *)0x0) {
      if (number < 0x20000000000000) {
        (*(this->super_UObject)._vptr_UObject[9])((double)number);
        temp.fUnion._48_8_ = extraout_XMM0_Qa;
        iVar3 = NumberFormat::getMaximumFractionDigits(&this->numberFormat->super_NumberFormat);
        if (iVar3 == 0) {
          temp.fUnion._48_8_ = uprv_floor_63((double)temp.fUnion._48_8_);
        }
        UnicodeString::UnicodeString((UnicodeString *)local_78);
        pDVar1 = this->numberFormat;
        Formattable::Formattable(&local_e8,(double)temp.fUnion._48_8_);
        Format::format((Format *)pDVar1,&local_e8,(UnicodeString *)local_78,status);
        Formattable::~Formattable(&local_e8);
        UnicodeString::insert(toInsertInto,_pos + this->pos,(UnicodeString *)local_78);
        UnicodeString::~UnicodeString((UnicodeString *)local_78);
      }
      else {
        iVar2 = (*(this->super_UObject)._vptr_UObject[8])(this,number);
        temp_1.fUnion._48_8_ = CONCAT44(extraout_var_00,iVar2);
        UnicodeString::UnicodeString((UnicodeString *)local_140);
        pDVar1 = this->numberFormat;
        Formattable::Formattable(&local_1b0,temp_1.fUnion._48_8_);
        Format::format((Format *)pDVar1,&local_1b0,(UnicodeString *)local_140,status);
        Formattable::~Formattable(&local_1b0);
        UnicodeString::insert(toInsertInto,_pos + this->pos,(UnicodeString *)local_140);
        UnicodeString::~UnicodeString((UnicodeString *)local_140);
      }
    }
  }
  else {
    this_00 = this->ruleSet;
    iVar2 = (*(this->super_UObject)._vptr_UObject[8])(this,number);
    NFRuleSet::format(this_00,CONCAT44(extraout_var,iVar2),toInsertInto,_pos + this->pos,
                      recursionCount,status);
  }
  return;
}

Assistant:

void
NFSubstitution::doSubstitution(int64_t number, UnicodeString& toInsertInto, int32_t _pos, int32_t recursionCount, UErrorCode& status) const
{
    if (ruleSet != NULL) {
        // Perform a transformation on the number that is dependent
        // on the type of substitution this is, then just call its
        // rule set's format() method to format the result
        ruleSet->format(transformNumber(number), toInsertInto, _pos + this->pos, recursionCount, status);
    } else if (numberFormat != NULL) {
        if (number <= MAX_INT64_IN_DOUBLE) {
            // or perform the transformation on the number (preserving
            // the result's fractional part if the formatter it set
            // to show it), then use that formatter's format() method
            // to format the result
            double numberToFormat = transformNumber((double)number);
            if (numberFormat->getMaximumFractionDigits() == 0) {
                numberToFormat = uprv_floor(numberToFormat);
            }

            UnicodeString temp;
            numberFormat->format(numberToFormat, temp, status);
            toInsertInto.insert(_pos + this->pos, temp);
        } 
        else { 
            // We have gone beyond double precision. Something has to give. 
            // We're favoring accuracy of the large number over potential rules 
            // that round like a CompactDecimalFormat, which is not a common use case. 
            // 
            // Perform a transformation on the number that is dependent 
            // on the type of substitution this is, then just call its 
            // rule set's format() method to format the result 
            int64_t numberToFormat = transformNumber(number); 
            UnicodeString temp;
            numberFormat->format(numberToFormat, temp, status);
            toInsertInto.insert(_pos + this->pos, temp);
        } 
    }
}